

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O0

Circle * EDCircles::addCircle
                   (Circle *circles,int *noCircles,double xc,double yc,double r,
                   double circleFitError,EllipseEquation *pEq,double ellipseFitError,double *x,
                   double *y,int noPixels)

{
  double dVar1;
  int noPixels_local;
  double *y_local;
  double *x_local;
  double ellipseFitError_local;
  EllipseEquation *pEq_local;
  double circleFitError_local;
  double r_local;
  double yc_local;
  double xc_local;
  int *noCircles_local;
  Circle *circles_local;
  
  circles[*noCircles].xc = xc;
  circles[*noCircles].yc = yc;
  circles[*noCircles].r = r;
  circles[*noCircles].circleFitError = circleFitError;
  dVar1 = computeEllipsePerimeter(pEq);
  circles[*noCircles].coverRatio = (double)noPixels / dVar1;
  circles[*noCircles].x = x;
  circles[*noCircles].y = y;
  circles[*noCircles].noPixels = noPixels;
  memcpy(&circles[*noCircles].eq,pEq,0x38);
  circles[*noCircles].ellipseFitError = ellipseFitError;
  circles[*noCircles].isEllipse = true;
  *noCircles = *noCircles + 1;
  return circles + (*noCircles + -1);
}

Assistant:

Circle * EDCircles::addCircle(Circle *circles, int &noCircles,double xc, double yc, double r, double circleFitError, EllipseEquation * pEq, double ellipseFitError, double * x, double * y, int noPixels)
{
	circles[noCircles].xc = xc;
	circles[noCircles].yc = yc;
	circles[noCircles].r = r;
	circles[noCircles].circleFitError = circleFitError;
	circles[noCircles].coverRatio = noPixels / computeEllipsePerimeter(pEq);

	circles[noCircles].x = x;
	circles[noCircles].y = y;
	circles[noCircles].noPixels = noPixels;

	circles[noCircles].eq = *pEq;
	circles[noCircles].ellipseFitError = ellipseFitError;
	circles[noCircles].isEllipse = true;

	noCircles++;

	return &circles[noCircles - 1];
}